

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::reserve
          (QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,qsizetype asize)

{
  pair<QModelIndex,_QPersistentModelIndex> *ppVar1;
  uint uVar2;
  Data *pDVar3;
  quintptr qVar4;
  int iVar5;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar6;
  long lVar7;
  QArrayData *pQVar8;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar9;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar10;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= (pDVar3->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 5))) {
    uVar2 = (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar2 & 1) != 0) goto LAB_0047d356;
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar2 | 1;
      goto LAB_0047d356;
    }
  }
  lVar7 = (this->d).size;
  if (asize < lVar7) {
    asize = lVar7;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppVar6 = (pair<QModelIndex,_QPersistentModelIndex> *)
           QArrayData::allocate(&local_30,0x20,0x10,asize,KeepSize);
  local_48.d = (Data *)local_30;
  local_48.size = 0;
  lVar7 = (this->d).size;
  local_48.ptr = ppVar6;
  if (lVar7 < 1) {
    lVar7 = 0;
    pQVar8 = local_30;
  }
  else {
    ppVar10 = (this->d).ptr;
    ppVar9 = ppVar10 + lVar7;
    do {
      ppVar6[local_48.size].first.m.ptr = (ppVar10->first).m.ptr;
      iVar5 = (ppVar10->first).c;
      qVar4 = (ppVar10->first).i;
      ppVar1 = ppVar6 + local_48.size;
      (ppVar1->first).r = (ppVar10->first).r;
      (ppVar1->first).c = iVar5;
      (ppVar1->first).i = qVar4;
      QPersistentModelIndex::QPersistentModelIndex(&ppVar6[local_48.size].second,&ppVar10->second);
      lVar7 = local_48.size + 1;
      ppVar10 = ppVar10 + 1;
      pQVar8 = &(local_48.d)->super_QArrayData;
      local_48.size = lVar7;
    } while (ppVar10 < ppVar9);
  }
  if (pQVar8 != (QArrayData *)0x0) {
    *(byte *)&(pQVar8->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pQVar8->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_48.d = (this->d).d;
  ppVar6 = (this->d).ptr;
  (this->d).d = (Data *)pQVar8;
  (this->d).ptr = local_48.ptr;
  local_48.size = (this->d).size;
  (this->d).size = lVar7;
  local_48.ptr = ppVar6;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::~QArrayDataPointer(&local_48);
LAB_0047d356:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}